

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::TestEventRepeater::~TestEventRepeater(TestEventRepeater *this)

{
  TestEventRepeater *this_local;
  
  (this->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_0019f2e8;
  ForEach<std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>,void(*)(testing::TestEventListener*)>
            (&this->listeners_,Delete<testing::TestEventListener>);
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::~vector
            (&this->listeners_);
  TestEventListener::~TestEventListener(&this->super_TestEventListener);
  return;
}

Assistant:

TestEventRepeater::~TestEventRepeater() {
  ForEach(listeners_, Delete<TestEventListener>);
}